

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::ShowPlotContextMenu(ImPlotPlot *plot)

{
  byte *pbVar1;
  ImPlotFlags IVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ImPlotAxis *pIVar7;
  ImPlotAxis *equal_axis;
  int i;
  int int_id;
  long lVar8;
  float fVar9;
  char local_4c;
  ImVec2 local_48;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  ImPlotAxis *local_38;
  
  IVar2 = plot->Flags;
  bVar4 = ImGui::BeginMenu("X-Axis",true);
  local_4c = (char)IVar2;
  if (bVar4) {
    ImGui::PushID("X");
    pIVar7 = (ImPlotAxis *)0x0;
    if (local_4c < '\0') {
      pIVar7 = plot->YAxis;
    }
    ShowAxisContextMenu(&plot->XAxis,pIVar7,true);
    ImGui::PopID();
    ImGui::EndMenu();
  }
  pIVar7 = plot->YAxis;
  local_38 = &plot->XAxis;
  lVar8 = 0;
  do {
    if (lVar8 == 3) {
      ImGui::Separator();
      bVar4 = ImGui::BeginMenu("Settings",true);
      if (bVar4) {
        bVar4 = ImGui::MenuItem("Anti-Aliased Lines",(char *)0x0,
                                (bool)((byte)((uint)plot->Flags >> 0xc) & 1),true);
        uVar6 = plot->Flags;
        if (bVar4) {
          uVar6 = uVar6 ^ 0x1000;
          plot->Flags = uVar6;
        }
        bVar4 = ImGui::MenuItem("Equal",(char *)0x0,(bool)((byte)uVar6 >> 7),true);
        uVar6 = plot->Flags;
        if (bVar4) {
          uVar6 = uVar6 ^ 0x80;
          plot->Flags = uVar6;
        }
        bVar4 = ImGui::MenuItem("Box Select",(char *)0x0,(uVar6 & 8) == 0,true);
        uVar6 = plot->Flags;
        if (bVar4) {
          uVar6 = uVar6 ^ 8;
          plot->Flags = uVar6;
        }
        bVar4 = ImGui::MenuItem("Query",(char *)0x0,(bool)((byte)(uVar6 >> 10) & 1),true);
        uVar6 = plot->Flags;
        if (bVar4) {
          uVar6 = uVar6 ^ 0x400;
          plot->Flags = uVar6;
        }
        bVar4 = ImGui::MenuItem("Title",(char *)0x0,(uVar6 & 1) == 0,true);
        uVar6 = plot->Flags;
        if (bVar4) {
          uVar6 = uVar6 ^ 1;
          plot->Flags = uVar6;
        }
        bVar4 = ImGui::MenuItem("Mouse Position",(char *)0x0,(uVar6 & 0x10) == 0,true);
        uVar6 = plot->Flags;
        if (bVar4) {
          uVar6 = uVar6 ^ 0x10;
          plot->Flags = uVar6;
        }
        bVar4 = ImGui::MenuItem("Crosshairs",(char *)0x0,(bool)((byte)(uVar6 >> 0xb) & 1),true);
        if (bVar4) {
          pbVar1 = (byte *)((long)&plot->Flags + 1);
          *pbVar1 = *pbVar1 ^ 8;
        }
        bVar4 = ImGui::BeginMenu("Legend",true);
        if (bVar4) {
          fVar9 = ImGui::GetFrameHeight();
          bVar4 = ImGui::RadioButton("H",plot->LegendOrientation == 0);
          if (bVar4) {
            plot->LegendOrientation = 0;
          }
          ImGui::SameLine(0.0,-1.0);
          bVar4 = ImGui::RadioButton("V",plot->LegendOrientation == 1);
          if (bVar4) {
            plot->LegendOrientation = 1;
          }
          ImGui::Checkbox("Outside",&plot->LegendOutside);
          local_48.x = 1.0;
          local_48.y = 1.0;
          ImGui::PushStyleVar(0xd,&local_48);
          local_48.x = fVar9 * 1.5;
          local_38 = (ImPlotAxis *)CONCAT44(local_38._4_4_,local_48.x);
          local_48.y = fVar9;
          bVar4 = ImGui::Button("##NW",&local_48);
          if (bVar4) {
            plot->LegendLocation = 5;
          }
          ImGui::SameLine(0.0,-1.0);
          local_48.x = local_38._0_4_;
          local_48.y = fVar9;
          bVar4 = ImGui::Button("##N",&local_48);
          if (bVar4) {
            plot->LegendLocation = 1;
          }
          ImGui::SameLine(0.0,-1.0);
          local_48.x = local_38._0_4_;
          local_48.y = fVar9;
          bVar4 = ImGui::Button("##NE",&local_48);
          if (bVar4) {
            plot->LegendLocation = 9;
          }
          local_48.x = local_38._0_4_;
          local_48.y = fVar9;
          bVar4 = ImGui::Button("##W",&local_48);
          if (bVar4) {
            plot->LegendLocation = 4;
          }
          ImGui::SameLine(0.0,-1.0);
          local_48.x = local_38._0_4_;
          local_48.y = fVar9;
          bVar4 = ImGui::Button("##C",&local_48);
          if (bVar4) {
            plot->LegendLocation = 0;
          }
          ImGui::SameLine(0.0,-1.0);
          local_48.x = local_38._0_4_;
          local_48.y = fVar9;
          bVar4 = ImGui::Button("##E",&local_48);
          if (bVar4) {
            plot->LegendLocation = 8;
          }
          local_48.x = local_38._0_4_;
          local_48.y = fVar9;
          bVar4 = ImGui::Button("##SW",&local_48);
          if (bVar4) {
            plot->LegendLocation = 6;
          }
          ImGui::SameLine(0.0,-1.0);
          local_48.x = local_38._0_4_;
          local_48.y = fVar9;
          bVar4 = ImGui::Button("##S",&local_48);
          if (bVar4) {
            plot->LegendLocation = 2;
          }
          ImGui::SameLine(0.0,-1.0);
          local_48.x = local_38._0_4_;
          local_48.y = fVar9;
          bVar4 = ImGui::Button("##SE",&local_48);
          if (bVar4) {
            plot->LegendLocation = 10;
          }
          ImGui::PopStyleVar(1);
          ImGui::EndMenu();
        }
        ImGui::EndMenu();
      }
      bVar4 = ImGui::MenuItem("Legend",(char *)0x0,(plot->Flags & 2) == 0,true);
      if (bVar4) {
        *(byte *)&plot->Flags = (byte)plot->Flags ^ 2;
      }
      return;
    }
    int_id = (int)lVar8;
    if (int_id == 2) {
      bVar3 = *(byte *)((long)&plot->Flags + 1) & 2;
joined_r0x001a0662:
      if (bVar3 != 0) {
        uStack_40 = 0;
        uStack_3f = 0;
        local_48.x = 0.0;
        local_48.y = 0.0;
        bVar4 = false;
        snprintf((char *)&local_48,9,"Y-Axis %d",(ulong)(int_id + 1));
        goto LAB_001a06b1;
      }
    }
    else {
      if (int_id == 1) {
        bVar3 = *(byte *)((long)&plot->Flags + 1) & 1;
        goto joined_r0x001a0662;
      }
      uStack_40 = 0;
      uStack_3f = 0;
      local_48.y = 4.14014e-41;
      local_48.x = 1.5672391e+34;
      bVar4 = true;
LAB_001a06b1:
      bVar5 = ImGui::BeginMenu((char *)&local_48,true);
      if (bVar5) {
        ImGui::PushID(int_id);
        equal_axis = (ImPlotAxis *)0x0;
        if (bVar4) {
          equal_axis = local_38;
        }
        if (-1 < local_4c) {
          equal_axis = (ImPlotAxis *)0x0;
        }
        ShowAxisContextMenu(pIVar7,equal_axis,false);
        ImGui::PopID();
        ImGui::EndMenu();
      }
    }
    lVar8 = lVar8 + 1;
    pIVar7 = pIVar7 + 1;
  } while( true );
}

Assistant:

void ShowPlotContextMenu(ImPlotPlot& plot) {
    const bool equal = ImHasFlag(plot.Flags, ImPlotFlags_Equal);
    if (ImGui::BeginMenu("X-Axis")) {
        ImGui::PushID("X");
        ShowAxisContextMenu(plot.XAxis, equal ? &plot.YAxis[0] : NULL, true);
        ImGui::PopID();
        ImGui::EndMenu();
    }
    for (int i = 0; i < IMPLOT_Y_AXES; i++) {
        if (i == 1 && !ImHasFlag(plot.Flags, ImPlotFlags_YAxis2)) {
            continue;
        }
        if (i == 2 && !ImHasFlag(plot.Flags, ImPlotFlags_YAxis3)) {
            continue;
        }
        char buf[10] = {};
        if (i == 0) {
            snprintf(buf, sizeof(buf) - 1, "Y-Axis");
        } else {
            snprintf(buf, sizeof(buf) - 1, "Y-Axis %d", i + 1);
        }
        if (ImGui::BeginMenu(buf)) {
            ImGui::PushID(i);
            ShowAxisContextMenu(plot.YAxis[i], (equal && i == 0) ? &plot.XAxis : NULL, false);
            ImGui::PopID();
            ImGui::EndMenu();
        }
    }

    ImGui::Separator();
    if ((ImGui::BeginMenu("Settings"))) {
        if (ImGui::MenuItem("Anti-Aliased Lines",NULL,ImHasFlag(plot.Flags, ImPlotFlags_AntiAliased)))
            ImFlipFlag(plot.Flags, ImPlotFlags_AntiAliased);
        if (ImGui::MenuItem("Equal", NULL, ImHasFlag(plot.Flags, ImPlotFlags_Equal)))
            ImFlipFlag(plot.Flags, ImPlotFlags_Equal);
        if (ImGui::MenuItem("Box Select",NULL,!ImHasFlag(plot.Flags, ImPlotFlags_NoBoxSelect)))
            ImFlipFlag(plot.Flags, ImPlotFlags_NoBoxSelect);
        if (ImGui::MenuItem("Query",NULL,ImHasFlag(plot.Flags, ImPlotFlags_Query)))
            ImFlipFlag(plot.Flags, ImPlotFlags_Query);
        if (ImGui::MenuItem("Title",NULL,!ImHasFlag(plot.Flags, ImPlotFlags_NoTitle)))
            ImFlipFlag(plot.Flags, ImPlotFlags_NoTitle);
        if (ImGui::MenuItem("Mouse Position",NULL,!ImHasFlag(plot.Flags, ImPlotFlags_NoMousePos)))
            ImFlipFlag(plot.Flags, ImPlotFlags_NoMousePos);
        if (ImGui::MenuItem("Crosshairs",NULL,ImHasFlag(plot.Flags, ImPlotFlags_Crosshairs)))
            ImFlipFlag(plot.Flags, ImPlotFlags_Crosshairs);
        if ((ImGui::BeginMenu("Legend"))) {
            const float s = ImGui::GetFrameHeight();
            if (ImGui::RadioButton("H", plot.LegendOrientation == ImPlotOrientation_Horizontal))
                plot.LegendOrientation = ImPlotOrientation_Horizontal;
            ImGui::SameLine();
            if (ImGui::RadioButton("V", plot.LegendOrientation == ImPlotOrientation_Vertical))
                plot.LegendOrientation = ImPlotOrientation_Vertical;
            ImGui::Checkbox("Outside", &plot.LegendOutside);
            ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(1,1));
            if (ImGui::Button("##NW",ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_NorthWest; } ImGui::SameLine();
            if (ImGui::Button("##N", ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_North;     } ImGui::SameLine();
            if (ImGui::Button("##NE",ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_NorthEast; }
            if (ImGui::Button("##W", ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_West;      } ImGui::SameLine();
            if (ImGui::Button("##C", ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_Center;    } ImGui::SameLine();
            if (ImGui::Button("##E", ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_East;      }
            if (ImGui::Button("##SW",ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_SouthWest; } ImGui::SameLine();
            if (ImGui::Button("##S", ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_South;     } ImGui::SameLine();
            if (ImGui::Button("##SE",ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_SouthEast; }
            ImGui::PopStyleVar();
            ImGui::EndMenu();
        }
        ImGui::EndMenu();
    }
    if (ImGui::MenuItem("Legend",NULL,!ImHasFlag(plot.Flags, ImPlotFlags_NoLegend))) {
        ImFlipFlag(plot.Flags, ImPlotFlags_NoLegend);
    }
}